

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

ExprPtr __thiscall mathiu::impl::substitute(impl *this,ExprPtr *ex,ExprPtr *srcDstPairs)

{
  element_type *value;
  anon_class_1_0_00000001 *func;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar1;
  undefined2 local_3cc;
  PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:1045:27)>
  local_3ca;
  Id<mathiu::impl::Pair> local_3c8;
  App<const_matchit::impl::AsPointer<mathiu::impl::Pair>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>_>
  local_390;
  PatternHelper<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Pair>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>_>_>
  local_338;
  anon_class_8_1_a8076a03 local_2e0;
  PatternPair<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Pair>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:1043:41)>
  local_2d8;
  Id<mathiu::impl::Set> local_278;
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  local_230;
  PatternHelper<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>
  local_1c8;
  anon_class_8_1_898cac37 local_160;
  PatternPair<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:1033:39)>
  local_158;
  ValueT local_e8;
  undefined1 local_e0 [8];
  RetType_conflict5 subMap;
  undefined1 local_a0 [8];
  Id<mathiu::impl::Pair> iPair;
  Id<mathiu::impl::Set> iSet;
  ExprPtr *srcDstPairs_local;
  ExprPtr *ex_local;
  
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)
             ((long)&iPair.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
             + 0x30));
  matchit::impl::Id<mathiu::impl::Pair>::Id((Id<mathiu::impl::Pair> *)local_a0);
  value = std::
          __shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)srcDstPairs);
  local_e8 = (ValueT)matchit::impl::match<mathiu::impl::Expr_const&>(value);
  local_160.iSet =
       (Id<mathiu::impl::Set> *)
       ((long)&iPair.mBlock.
               super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
               .
               super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
               .
               super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
               .
               super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
       + 0x30);
  matchit::impl::Id<mathiu::impl::Set>::Id(&local_278,local_160.iSet);
  matchit::impl::as<mathiu::impl::Set>::{lambda(auto:1)#1}::operator()
            (&local_230,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Set>,&local_278);
  matchit::impl::PatternPipable::operator|
            (&local_1c8,(PatternPipable *)&matchit::impl::pattern,&local_230);
  matchit::impl::
  PatternHelper<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Set>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Set>>>>>
  ::operator=(&local_158,
              (PatternHelper<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Set>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Set>>>>>
               *)&local_1c8,&local_160);
  local_2e0.iPair = (Id<mathiu::impl::Pair> *)local_a0;
  matchit::impl::Id<mathiu::impl::Pair>::Id(&local_3c8,local_2e0.iPair);
  matchit::impl::as<mathiu::impl::Pair>::{lambda(auto:1)#1}::operator()
            (&local_390,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Pair>,&local_3c8);
  matchit::impl::PatternPipable::operator|
            (&local_338,(PatternPipable *)&matchit::impl::pattern,&local_390);
  matchit::impl::
  PatternHelper<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Pair>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Pair>>>>>
  ::operator=(&local_2d8,
              (PatternHelper<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Pair>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Pair>>>>>
               *)&local_338,&local_2e0);
  matchit::impl::PatternPipable::operator|
            ((PatternPipable *)&matchit::impl::pattern,(Wildcard *)&matchit::impl::_);
  matchit::impl::PatternHelper<matchit::impl::Wildcard>::operator=
            ((PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:1045:27)>
              *)&local_3cc,(PatternHelper<matchit::impl::Wildcard> *)((long)&local_3cc + 1),func);
  matchit::impl::MatchHelper<mathiu::impl::Expr_const&,true>::operator()
            ((RetType_conflict5 *)local_e0,(MatchHelper<mathiu::impl::Expr_const&,true> *)&local_e8,
             &local_158,&local_2d8,&local_3ca);
  matchit::impl::
  PatternPair<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Pair>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:1043:41)>
  ::~PatternPair(&local_2d8);
  matchit::impl::
  PatternHelper<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Pair>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>_>_>
  ::~PatternHelper(&local_338);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Pair>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>_>
  ::~App(&local_390);
  matchit::impl::Id<mathiu::impl::Pair>::~Id(&local_3c8);
  matchit::impl::
  PatternPair<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:1033:39)>
  ::~PatternPair(&local_158);
  matchit::impl::
  PatternHelper<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>
  ::~PatternHelper(&local_1c8);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  ::~App(&local_230);
  matchit::impl::Id<mathiu::impl::Set>::~Id(&local_278);
  substituteImpl(this,ex,(ExprPtrMap *)local_e0);
  std::
  map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  ::~map((map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
          *)local_e0);
  matchit::impl::Id<mathiu::impl::Pair>::~Id((Id<mathiu::impl::Pair> *)local_a0);
  matchit::impl::Id<mathiu::impl::Set>::~Id
            ((Id<mathiu::impl::Set> *)
             ((long)&iPair.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
             + 0x30));
  EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr substitute(ExprPtr const &ex, ExprPtr const &srcDstPairs)
    {
#if VERBOSE_DEBUG
        std::cout << "substitute: " << toString(ex) << " " << toString(srcDstPairs) << std::endl;
#endif // VERBOSE_DEBUG
        Id<Set> iSet;
        Id<Pair> iPair;
        auto const subMap = match(*srcDstPairs)(
            pattern | as<Set>(iSet) = [&]
            {
                ExprPtrMap result;
                std::transform((*iSet).begin(), (*iSet).end(), std::inserter(result, result.end()), [&](auto &&e)
                               {
                                   auto pair = std::get<Pair>(*e);
                                   return pair;
                               });
                return result;
            },
            pattern | as<Pair>(iPair) = [&]
            { return ExprPtrMap{{{(*iPair).first, (*iPair).second}}}; },
            pattern | _ = [&]
            {
                throw std::runtime_error("Mismatch in substitute!");
                return ExprPtrMap{};
            });
        return substituteImpl(ex, subMap);
    }